

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::TransformNode::resetInDegree(TransformNode *this)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x58) = 0;
  if ((*(long *)(in_RDI + 0x50) == 1) &&
     ((**(code **)(**(long **)(in_RDI + 0x98) + 0x40))(), 1 < *(ulong *)(in_RDI + 0x78))) {
    (**(code **)(**(long **)(in_RDI + 0x98) + 0x40))();
  }
  *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + -1;
  return;
}

Assistant:

void SceneGraph::TransformNode::resetInDegree()
  {
    closed = false;
    if (indegree == 1) {
      child->resetInDegree();
      if (spaces.size() > 1) child->resetInDegree(); // break instance up when motion blur is used
    }
    indegree--;
  }